

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeKernelSetArgumentValue
          (ze_kernel_handle_t hKernel,uint32_t argIndex,size_t argSize,void *pArgValue)

{
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar1;
  ze_result_t zVar2;
  iterator iVar3;
  iterator iVar4;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)(hKernel + 8) + 0x580);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    uVar1 = *(undefined8 *)hKernel;
    if (pArgValue == (void *)0x0) {
      pArgValue = (mapped_type *)0x0;
    }
    else {
      __mutex = (pthread_mutex_t *)(context + 0x1500);
      std::mutex::lock((mutex *)&__mutex->__data);
      __mutex_00 = (pthread_mutex_t *)(context + 0x1528);
      std::mutex::lock((mutex *)&__mutex_00->__data);
      iVar3 = std::
              _Hashtable<object_t<_ze_image_handle_t_*>_*,_std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<object_t<_ze_image_handle_t_*>_*,_std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(context + 0x1550),(key_type *)pArgValue);
      if (iVar3.
          super__Node_iterator_base<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        iVar4 = std::
                _Hashtable<object_t<_ze_sampler_handle_t_*>_*,_std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<object_t<_ze_sampler_handle_t_*>_*,_std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(context + 0x1588),(key_type *)pArgValue);
        if (iVar4.
            super__Node_iterator_base<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_false>
            ._M_cur != (__node_type *)0x0) {
          pArgValue = std::__detail::
                      _Map_base<object_t<_ze_sampler_handle_t_*>_*,_std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<object_t<_ze_sampler_handle_t_*>_*,_std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)(context + 0x1588),(key_type *)pArgValue);
        }
      }
      else {
        pArgValue = std::__detail::
                    _Map_base<object_t<_ze_image_handle_t_*>_*,_std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<object_t<_ze_image_handle_t_*>_*,_std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>,_std::allocator<std::pair<object_t<_ze_image_handle_t_*>_*const,__ze_image_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_image_handle_t_*>_*>,_std::hash<object_t<_ze_image_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)(context + 0x1550),(key_type *)pArgValue);
      }
      pthread_mutex_unlock(__mutex_00);
      pthread_mutex_unlock(__mutex);
    }
    zVar2 = (*UNRECOVERED_JUMPTABLE)(uVar1,argIndex,argSize,pArgValue);
    return zVar2;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetArgumentValue(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t argIndex,                              ///< [in] argument index in range [0, num args - 1]
        size_t argSize,                                 ///< [in] size of argument type
        const void* pArgValue                           ///< [in][optional] argument value represented as matching arg type. If
                                                        ///< null then argument value is considered null.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_kernel_object_t*>( hKernel )->dditable;
        auto pfnSetArgumentValue = dditable->ze.Kernel.pfnSetArgumentValue;
        if( nullptr == pfnSetArgumentValue )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hKernel = reinterpret_cast<ze_kernel_object_t*>( hKernel )->handle;

        // convert pArgValue to correct handle if applicable
        void *internalArgValue = const_cast<void *>(pArgValue);
        if (pArgValue) {
            // check if the arg value is a translated handle
            ze_image_object_t **imageHandle = static_cast<ze_image_object_t **>(internalArgValue);
            ze_sampler_object_t **samplerHandle = static_cast<ze_sampler_object_t **>(internalArgValue);
            {
                std::lock_guard<std::mutex> image_lock(context->image_handle_map_lock);
                std::lock_guard<std::mutex> sampler_lock(context->sampler_handle_map_lock);
                if( context->image_handle_map.find(*imageHandle) != context->image_handle_map.end() ) {
                    internalArgValue = &context->image_handle_map[*imageHandle];
                } else if( context->sampler_handle_map.find(*samplerHandle) != context->sampler_handle_map.end() ) {
                    internalArgValue = &context->sampler_handle_map[*samplerHandle];
                }
            }
        }
        // forward to device-driver
        result = pfnSetArgumentValue( hKernel, argIndex, argSize, const_cast<const void *>(internalArgValue) );

        return result;
    }